

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall pybind11::object::~object(object *this)

{
  PyObject *pPVar1;
  
  pPVar1 = (this->super_handle).m_ptr;
  if ((pPVar1 != (PyObject *)0x0) &&
     (pPVar1->ob_refcnt = pPVar1->ob_refcnt + -1, pPVar1->ob_refcnt == 0)) {
    _Py_Dealloc();
  }
  return;
}

Assistant:

~object() { dec_ref(); }